

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

int whisper_wrap_segment(whisper_context *ctx,whisper_state *state,int max_len,bool split_on_word)

{
  pointer pwVar1;
  pointer pwVar2;
  char *__s;
  size_t sVar3;
  int iVar4;
  size_type __new_size;
  int iVar5;
  int local_124;
  string text;
  value_type segment;
  whisper_segment local_88;
  
  whisper_segment::whisper_segment
            (&segment,(state->result_all).
                      super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  local_124 = 1;
  iVar5 = 0;
  iVar4 = 0;
  while( true ) {
    pwVar2 = segment.tokens.
             super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)(((long)segment.tokens.
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)segment.tokens.
                    super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x38) <= iVar5) break;
    __new_size = (size_type)iVar5;
    if (segment.tokens.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
        _M_impl.super__Vector_impl_data._M_start[__new_size].id < (ctx->vocab).token_eot) {
      __s = whisper_token_to_str
                      (ctx,segment.tokens.
                           super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                           ._M_impl.super__Vector_impl_data._M_start[__new_size].id);
      sVar3 = strlen(__s);
      iVar4 = iVar4 + (int)sVar3;
      if (((iVar5 < 1) || (iVar4 <= max_len)) || ((split_on_word && (*__s != ' ')))) {
        std::__cxx11::string::append((char *)&text);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)
                   &(state->result_all).
                    super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].text,(string *)&text);
        pwVar1 = (state->result_all).
                 super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pwVar1[-1].t1 = pwVar2[__new_size].t0;
        std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>::resize
                  (&pwVar1[-1].tokens,__new_size);
        (state->result_all).super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].speaker_turn_next = false;
        local_88.t0 = 0;
        local_88.t1 = 0;
        local_88.text._M_dataplus._M_p = (pointer)&local_88.text.field_2;
        local_88.text._M_string_length = 0;
        local_88.text.field_2._M_local_buf[0] = '\0';
        local_88.no_speech_prob = 0.0;
        local_88.tokens.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_88._73_8_ = 0;
        local_88.tokens.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.tokens.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_88.tokens.super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        std::vector<whisper_segment,_std::allocator<whisper_segment>_>::
        emplace_back<whisper_segment>(&state->result_all,&local_88);
        whisper_segment::~whisper_segment(&local_88);
        pwVar1 = (state->result_all).
                 super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pwVar1[-1].t0 = pwVar2[__new_size].t0;
        pwVar1[-1].t1 = segment.t1;
        std::vector<whisper_token_data,std::allocator<whisper_token_data>>::
        insert<__gnu_cxx::__normal_iterator<whisper_token_data*,std::vector<whisper_token_data,std::allocator<whisper_token_data>>>,void>
                  ((vector<whisper_token_data,std::allocator<whisper_token_data>> *)
                   &pwVar1[-1].tokens,
                   pwVar1[-1].tokens.
                   super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   segment.tokens.
                   super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                   _M_impl.super__Vector_impl_data._M_start + __new_size,
                   (__normal_iterator<whisper_token_data_*,_std::vector<whisper_token_data,_std::allocator<whisper_token_data>_>_>
                    )segment.tokens.
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        (state->result_all).super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].speaker_turn_next = segment.speaker_turn_next;
        std::__cxx11::string::assign((char *)&text);
        whisper_segment::operator=
                  (&segment,(state->result_all).
                            super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -1);
        local_124 = local_124 + 1;
        iVar4 = 0;
        iVar5 = -1;
      }
    }
    iVar5 = iVar5 + 1;
  }
  std::__cxx11::string::operator=
            ((string *)
             &(state->result_all).
              super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].text,(string *)&text);
  std::__cxx11::string::~string((string *)&text);
  whisper_segment::~whisper_segment(&segment);
  return local_124;
}

Assistant:

static int whisper_wrap_segment(struct whisper_context & ctx, struct whisper_state & state, int max_len, bool split_on_word) {
    auto segment = state.result_all.back();

    int res = 1;
    int acc = 0;

    std::string text;

    for (int i = 0; i < (int) segment.tokens.size(); i++) {
        const auto & token = segment.tokens[i];
        if (token.id >= whisper_token_eot(&ctx)) {
            continue;
        }

        const auto txt = whisper_token_to_str(&ctx, token.id);
        const int cur = strlen(txt);

        if (acc + cur > max_len && i > 0 && should_split_on_word(txt, split_on_word)) {
            state.result_all.back().text = std::move(text);
            state.result_all.back().t1 = token.t0;
            state.result_all.back().tokens.resize(i);
            state.result_all.back().speaker_turn_next = false;

            state.result_all.push_back({});
            state.result_all.back().t0 = token.t0;
            state.result_all.back().t1 = segment.t1;

            // add tokens [i, end] to the new segment
            state.result_all.back().tokens.insert(
                state.result_all.back().tokens.end(),
                    segment.tokens.begin() + i,
                    segment.tokens.end());

            state.result_all.back().speaker_turn_next = segment.speaker_turn_next;

            acc = 0;
            text = "";

            segment = state.result_all.back();
            i = -1;

            res++;
        } else {
            acc += cur;
            text += txt;
        }
    }

    state.result_all.back().text = std::move(text);

    return res;
}